

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButtonPrivate::emitPressed(QAbstractButtonPrivate *this)

{
  QObject *button;
  QButtonGroup *this_00;
  int _t1;
  int *piVar1;
  
  button = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  if (button == (QObject *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(button);
  }
  QMetaObject::activate(button,&QAbstractButton::staticMetaObject,0,(void **)0x0);
  if (piVar1 != (int *)0x0) {
    if (((button != (QObject *)0x0) && (piVar1[1] != 0)) &&
       (this_00 = this->group, this_00 != (QButtonGroup *)0x0)) {
      _t1 = QButtonGroup::id(this_00,(QAbstractButton *)button);
      QButtonGroup::idPressed(this_00,_t1);
      if (piVar1 == (int *)0x0) {
        return;
      }
      if ((piVar1[1] != 0) && (this->group != (QButtonGroup *)0x0)) {
        QButtonGroup::buttonPressed(this->group,(QAbstractButton *)button);
      }
    }
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        operator_delete(piVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

void QAbstractButtonPrivate::emitPressed()
{
    Q_Q(QAbstractButton);
    QPointer<QAbstractButton> guard(q);
    emit q->pressed();
#if QT_CONFIG(buttongroup)
    if (guard && group) {
        emit group->idPressed(group->id(q));
        if (guard && group)
            emit group->buttonPressed(q);
    }
#endif
}